

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalCreateFileMapping
                    (CPalThread *pThread,HANDLE hFile,LPSECURITY_ATTRIBUTES lpFileMappingAttributes,
                    DWORD flProtect,DWORD dwMaximumSizeHigh,DWORD dwMaximumSizeLow,LPCWSTR lpName,
                    HANDLE *phMapping)

{
  FILE *__stream;
  IPalObject *pIVar1;
  PAL_ERROR PVar2;
  int iVar3;
  BOOL BVar4;
  int __fd;
  errno_t eVar5;
  DWORD DVar6;
  size_t sVar7;
  IFileLockController *pIVar8;
  int *piVar9;
  char *pcVar10;
  __syscall_slong_t *p_Var11;
  undefined8 uVar12;
  CFileProcessLocalData *pCVar13;
  int iVar14;
  undefined1 local_120 [8];
  stat UnixFileInformation;
  CObjectAttributes objectAttributes;
  IPalObject *pRegisteredMapping;
  CFileMappingProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  CFileProcessLocalData *pFileLocalData;
  IDataLock *pFileLocalDataLock;
  IPalObject *pMapping;
  CFileMappingImmutableData *pImmutableData;
  
  UnixFileInformation.__glibc_reserved[2] = 0;
  objectAttributes.sObjectName.m_pwsz = (WCHAR *)0x0;
  objectAttributes.sObjectName._8_8_ = lpFileMappingAttributes;
  pImmutableData._4_4_ = dwMaximumSizeLow;
  if (lpName != (LPCWSTR)0x0) {
    sVar7 = PAL_wcslen(lpName);
    UnixFileInformation.__glibc_reserved[2] = (__syscall_slong_t)lpName;
    objectAttributes.sObjectName.m_pwsz = (WCHAR *)CONCAT44((int)sVar7 + 1,(int)sVar7);
  }
  pFileLocalDataLock = (IDataLock *)0x0;
  objectAttributes.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  pRegisteredMapping = (IPalObject *)0x0;
  pLocalData = (CFileMappingProcessLocalData *)0x0;
  pMapping = (IPalObject *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  pFileObject = (IPalObject *)0x0;
  pFileLocalData = (CFileProcessLocalData *)0x0;
  if (lpName != (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x1a8);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    PVar2 = 0x32;
    __fd = -1;
    goto LAB_00333f51;
  }
  if (dwMaximumSizeHigh == 0) {
    if ((flProtect < 9) && ((0x114U >> (flProtect & 0x1f) & 1) != 0)) {
      if (pImmutableData._4_4_ != 0 || (undefined1 *)hFile != &DAT_ffffffffffffffff) {
        p_Var11 = UnixFileInformation.__glibc_reserved + 2;
        PVar2 = (**(code **)*g_pObjectManager)
                          (g_pObjectManager,pThread,&otFileMapping,p_Var11,&pFileLocalDataLock);
        iVar14 = -1;
        __fd = iVar14;
        if ((PVar2 != 0) ||
           (PVar2 = (*pFileLocalDataLock->_vptr_IDataLock[2])(pFileLocalDataLock,&pMapping),
           PVar2 != 0)) goto LAB_00333f51;
        if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
          eVar5 = strcpy_s((char *)pMapping,0x1000,"/dev/zero");
          if ((eVar5 == 0) &&
             (__fd = InternalOpen((char *)pMapping,2),
             UnixFileInformation.st_rdev = (__dev_t)p_Var11, __fd != -1)) goto LAB_0033419b;
          PVar2 = 0x54f;
        }
        else {
          iVar3 = (**(code **)(*g_pObjectManager + 0x28))
                            (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalDataLock);
          if (iVar3 == 0) {
            PVar2 = (*pLocalDataLock->_vptr_IDataLock[3])
                              (pLocalDataLock,pThread,0,&pFileLocalData,&pFileObject);
            pIVar1 = pFileObject;
            if (PVar2 != 0) goto LAB_00333f51;
            BVar4 = MAPIsRequestPermissible(flProtect,(CFileProcessLocalData *)pFileObject);
            if (BVar4 == 0) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_00333fe0;
              PVar2 = 5;
LAB_0033427f:
              if (pFileLocalData == (CFileProcessLocalData *)0x0) goto LAB_00333f51;
              pIVar8 = pFileLocalData->pLockController;
              uVar12 = 0;
              pCVar13 = pFileLocalData;
            }
            else {
              __fd = dup(*(int *)&pIVar1[1]._vptr_IPalObject);
              if ((__fd == -1) ||
                 (eVar5 = strcpy_s((char *)pMapping,0x1000,(char *)(pFileObject + 3)), iVar14 = __fd
                 , eVar5 != 0)) {
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_00333fe0;
                PVar2 = 0x54f;
                __fd = iVar14;
                goto LAB_0033427f;
              }
              if (pFileLocalData != (CFileProcessLocalData *)0x0) {
                (*(code *)pFileLocalData->pLockController->_vptr_IFileLockController)
                          (pFileLocalData,pThread,0);
              }
              iVar3 = fstat64(__fd,(stat64 *)local_120);
              if (iVar3 == -1) {
                fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                        ,0x265);
                __stream = _stderr;
                piVar9 = __errno_location();
                pcVar10 = strerror(*piVar9);
                fprintf(__stream,"fstat() failed for this reason %s.\n",pcVar10);
                PVar2 = 0x54f;
                goto LAB_00333f51;
              }
              if (UnixFileInformation.st_rdev == 0 && pImmutableData._4_4_ == 0) {
                PVar2 = 0x3ee;
                goto LAB_003340ed;
              }
              if ((uint)UnixFileInformation.st_rdev < pImmutableData._4_4_) {
                if ((flProtect == 8) || (flProtect == 2)) {
                  PVar2 = 8;
                  goto LAB_003340ed;
                }
                if (PAL_InitializeChakraCoreCalled == false) goto LAB_00333fe0;
                PVar2 = MAPGrowLocalFile(__fd,pImmutableData._4_4_);
                if (PVar2 != 0) {
                  if (PAL_InitializeChakraCoreCalled != false) goto LAB_00333f51;
                  goto LAB_00333fe0;
                }
              }
LAB_0033419b:
              DVar6 = (DWORD)UnixFileInformation.st_rdev;
              if (pImmutableData._4_4_ != 0) {
                DVar6 = pImmutableData._4_4_;
              }
              *(DWORD *)&pMapping[0x200]._vptr_IPalObject = DVar6;
              *(DWORD *)((long)&pMapping[0x200]._vptr_IPalObject + 4) = flProtect;
              *(undefined4 *)&pMapping[0x201]._vptr_IPalObject = 0;
              DVar6 = MAPConvertProtectToAccess(flProtect);
              *(DWORD *)((long)&pMapping[0x201]._vptr_IPalObject + 4) = DVar6;
              PVar2 = (*pFileLocalDataLock->_vptr_IDataLock[3])
                                (pFileLocalDataLock,pThread,1,&pLocalData,&pRegisteredMapping);
              if (PVar2 == 0) {
                *(int *)&pRegisteredMapping->_vptr_IPalObject = __fd;
                (*(code *)**(undefined8 **)pLocalData)(pLocalData,pThread,1);
                pLocalData = (CFileMappingProcessLocalData *)0x0;
                PVar2 = (**(code **)(*g_pObjectManager + 8))
                                  (g_pObjectManager,pThread,pFileLocalDataLock,&aotFileMapping,
                                   flProtect,phMapping,&objectAttributes.pSecurityAttributes);
                pFileLocalDataLock = (IDataLock *)0x0;
              }
              if (pLocalData == (CFileMappingProcessLocalData *)0x0) goto LAB_00333f51;
              pIVar8 = *(IFileLockController **)pLocalData;
              uVar12 = 1;
              pCVar13 = (CFileProcessLocalData *)pLocalData;
            }
            (*(code *)pIVar8->_vptr_IFileLockController)(pCVar13,pThread,uVar12);
            goto LAB_00333f51;
          }
          PVar2 = 0x57;
        }
LAB_003340ed:
        __fd = iVar14;
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_00333fe0:
          abort();
        }
        goto LAB_00333f51;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00333fe0;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
              ,0x1ba);
      fprintf(_stderr,
              "invalid flProtect %#x, acceptable values are PAGE_READONLY (%#x), PAGE_READWRITE (%#x) and PAGE_WRITECOPY (%#x).\n"
              ,(ulong)flProtect,2,4,8);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateFileMapping",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x1af);
    fprintf(_stderr,"dwMaximumSizeHigh is always 0.\n");
  }
  PVar2 = 0x57;
  __fd = -1;
LAB_00333f51:
  if ((pFileLocalDataLock != (IDataLock *)0x0) &&
     ((*pFileLocalDataLock->_vptr_IDataLock[8])(pFileLocalDataLock,pThread), __fd != -1)) {
    close(__fd);
  }
  if (objectAttributes.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)objectAttributes.pSecurityAttributes + 0x40))
              (objectAttributes.pSecurityAttributes,pThread);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateFileMapping(
    CPalThread *pThread,
    HANDLE hFile,
    LPSECURITY_ATTRIBUTES lpFileMappingAttributes,
    DWORD flProtect,
    DWORD dwMaximumSizeHigh,
    DWORD dwMaximumSizeLow,
    LPCWSTR lpName,
    HANDLE *phMapping
    )
{
    CObjectAttributes objectAttributes(lpName, lpFileMappingAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pMapping = NULL;
    IPalObject *pRegisteredMapping = NULL;
    CFileMappingProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    CFileMappingImmutableData *pImmutableData = NULL;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pFileLocalData = NULL;
    IDataLock *pFileLocalDataLock = NULL;
    
    struct stat UnixFileInformation;
    INT UnixFd = -1;
    BOOL bPALCreatedTempFile = FALSE;
    UINT nFileSize = 0;

    //
    // Validate parameters
    //

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto ExitInternalCreateFileMapping;
    }

    if (0 != dwMaximumSizeHigh)
    {
        ASSERT("dwMaximumSizeHigh is always 0.\n");
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }
    
    if (PAGE_READWRITE != flProtect
        && PAGE_READONLY != flProtect
        && PAGE_WRITECOPY != flProtect)
    {
        ASSERT( "invalid flProtect %#x, acceptable values are PAGE_READONLY "
                "(%#x), PAGE_READWRITE (%#x) and PAGE_WRITECOPY (%#x).\n", 
                flProtect, PAGE_READONLY, PAGE_READWRITE, PAGE_WRITECOPY );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }

    if (hFile == INVALID_HANDLE_VALUE && 0 == dwMaximumSizeLow)
    {
        ERROR( "If hFile is INVALID_HANDLE_VALUE, then you must specify a size.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }

    if (hFile != INVALID_HANDLE_VALUE && NULL != lpName)
    {
        ASSERT( "If hFile is not -1, then lpName must be NULL.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalCreateFileMapping;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFileMapping,
        &objectAttributes,
        &pMapping
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalCreateFileMapping;
    }

    palError = pMapping->GetImmutableData(reinterpret_cast<void**>(&pImmutableData));
    if (NO_ERROR != palError)
    {
        goto ExitInternalCreateFileMapping;
    }

    if (hFile == INVALID_HANDLE_VALUE)
    {
        //
        // Note: this path is what prevents us supporting the
        // duplication of file mapping objects across processes, since
        // there is no backing file that the other process can open. We can
        // avoid this restriction by always using a temp backing file for
        // anonymous mappings.
        //
        
        /* Anonymous mapped files. */
        if (strcpy_s(pImmutableData->szFileName, sizeof(pImmutableData->szFileName), "/dev/zero") != SAFECRT_SUCCESS)
        {
            ERROR( "strcpy_s failed!\n" );
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }

#if HAVE_MMAP_DEV_ZERO

        UnixFd = InternalOpen(pImmutableData->szFileName, O_RDWR);
        if ( -1 == UnixFd )
        {
            ERROR( "Unable to open the file.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }

#else //!HAVE_MMAP_DEV_ZERO

        UnixFd = -1;  /* will pass MAP_ANON to mmap() instead */

#endif //!HAVE_MMAP_DEV_ZERO

    }
    else
    {
        if ( hFile != INVALID_HANDLE_VALUE )
        {
            palError = g_pObjectManager->ReferenceObjectByHandle(
                pThread,
                hFile,
                &aotFile,
                GENERIC_READ,
                &pFileObject
                );

            if (NO_ERROR != palError)
            {
                ERROR("Unable to obtain file data.\n");
                palError = ERROR_INVALID_PARAMETER;
                goto ExitInternalCreateFileMapping;
            }

            palError = pFileObject->GetProcessLocalData(
                pThread,
                ReadLock, 
                &pFileLocalDataLock,
                reinterpret_cast<void**>(&pFileLocalData)
                );

            if (NO_ERROR != palError)
            {
                goto ExitInternalCreateFileMapping;
            }
        
            /* We need to check to ensure flProtect jives with 
               the permission on the file handle */
            if (!MAPIsRequestPermissible(flProtect, pFileLocalData))
            {
                ERROR("File handle does not have the correct "
                      "permissions to create mapping\n" );
                palError = ERROR_ACCESS_DENIED;
                if (NULL != pFileLocalDataLock)
                {
                    pFileLocalDataLock->ReleaseLock(pThread, FALSE);
                }
                goto ExitInternalCreateFileMapping;
            }

            //
            // TODO: technically, the file mapping object should hold
            // a reference to the passed in file object. This implementation
            // only keeps the underlying native file structure (i.e., what
            // the duplicated descriptors point to) open. There may be a risk
            // here pertaining to the file lock information that the PAL must
            // maintain (e.g,. if the passed in handle is closed immediately
            // after the file mapping is opened then the lock information will
            // be released, since we're not doing anything to keep it alive
            // here).
            //
            // Having a direct reference to the underlying file object adds
            // some complication, especially in cross-process cases. We may
            // want to consider adding a reference to the PAL's file lock
            // information, though...
            //
            
            UnixFd = dup(pFileLocalData->unix_fd);
            if (-1 == UnixFd)
            {
                ERROR( "Unable to duplicate the Unix file descriptor!\n" );
                palError = ERROR_INTERNAL_ERROR;
                if (NULL != pFileLocalDataLock)
                {
                    pFileLocalDataLock->ReleaseLock(pThread, FALSE);
                }
                goto ExitInternalCreateFileMapping;
            }
  
            if (strcpy_s(pImmutableData->szFileName, sizeof(pImmutableData->szFileName), pFileLocalData->unix_filename) != SAFECRT_SUCCESS)
            {
                ERROR( "strcpy_s failed!\n" );
                palError = ERROR_INTERNAL_ERROR;
                if (NULL != pFileLocalDataLock)
                {
                    pFileLocalDataLock->ReleaseLock(pThread, FALSE);
                }
                goto ExitInternalCreateFileMapping;
            }

            if (NULL != pFileLocalDataLock)
            {
                pFileLocalDataLock->ReleaseLock(pThread, FALSE);
            }
        } 
        else 
        {
            ASSERT("should not get here\n");
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }
    
        if (-1 == fstat(UnixFd, &UnixFileInformation))
        {
            ASSERT("fstat() failed for this reason %s.\n", strerror(errno));
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }

        if ( 0 == UnixFileInformation.st_size && 
             0 == dwMaximumSizeHigh && 0 == dwMaximumSizeLow )
        {
            ERROR( "The file cannot be a zero length file.\n" );
            palError = ERROR_FILE_INVALID;
            goto ExitInternalCreateFileMapping;
        }

        if ( INVALID_HANDLE_VALUE != hFile && 
             dwMaximumSizeLow > (DWORD) UnixFileInformation.st_size && 
             ( PAGE_READONLY == flProtect || PAGE_WRITECOPY == flProtect ) )
        {
            /* In this situation, Windows returns an error, because the
               permissions requested do not allow growing the file */
            ERROR( "The file cannot be grown do to the map's permissions.\n" );
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto ExitInternalCreateFileMapping;
        }
      
        if ( (DWORD) UnixFileInformation.st_size < dwMaximumSizeLow )
        {
            TRACE( "Growing the size of file on disk to match requested size.\n" );

            /* Need to grow the file on disk to match size. */
            palError = MAPGrowLocalFile(UnixFd, dwMaximumSizeLow);
            if (NO_ERROR != palError)
            {
                ERROR( "Unable to grow the file on disk.\n" );
                goto ExitInternalCreateFileMapping;
            }
        }
    }

    nFileSize = ( 0 == dwMaximumSizeLow && 0 == dwMaximumSizeHigh ) ? 
        UnixFileInformation.st_size : dwMaximumSizeLow;

    pImmutableData->MaxSize = nFileSize;
    pImmutableData->flProtect = flProtect;
    pImmutableData->bPALCreatedTempFile = bPALCreatedTempFile;
    pImmutableData->dwDesiredAccessWhenOpened = MAPConvertProtectToAccess(flProtect);
    

    //
    // The local data isn't grabbed / modified until here so that we don't
    // need to worry ourselves with locking issues with the passed in
    // file handle -- all operations concerning the file handle are completed
    // before we deal with the lock for the new object.
    //

    palError = pMapping->GetProcessLocalData(
        pThread,
        WriteLock,
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalCreateFileMapping;
    }

    pLocalData->UnixFd = UnixFd;

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    if (-1 == UnixFd)
    {
        pLocalData->MappedFileDevNum = (dev_t)-1; /* there is no standard NO_DEV */
        pLocalData->MappedFileInodeNum = NO_INO;
    }
    else
    {
        struct stat st;

        if (0 == fstat(UnixFd, &st))
        {
            pLocalData->MappedFileDevNum = st.st_dev;
            pLocalData->MappedFileInodeNum = st.st_ino;
        }
        else
        {
            ERROR("Couldn't get inode info for fd=%d to be stored in mapping object\n", UnixFd);
            palError = ERROR_INTERNAL_ERROR;
            goto ExitInternalCreateFileMapping;
        }
    }
#endif

    pLocalDataLock->ReleaseLock(pThread, TRUE);
    pLocalDataLock = NULL;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pMapping,
        &aotFileMapping, 
        flProtect,          // TODO: is flProtect really an access right?
        phMapping,
        &pRegisteredMapping
        );

    //
    // pMapping is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line. This also ensures that we won't attempt to release
    // any data associated with the mapping object here, as if any cleanup is
    // necessary due to a failure in RegisterObject (which includes another
    // object by the same name already existing) the cleanup will take place
    // when that routine releases the reference to pMapping.
    //
    
    pMapping = NULL;

ExitInternalCreateFileMapping:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(
            pThread,
            TRUE
            );
    }

    if (NULL != pMapping)
    {
        pMapping->ReleaseReference(pThread);

        if (bPALCreatedTempFile)
        {
            unlink(pImmutableData->szFileName);
        }

        if (-1 != UnixFd)
        {
            close(UnixFd);
        }
    }

    if (NULL != pRegisteredMapping)
    {
        pRegisteredMapping->ReleaseReference(pThread);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}